

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeTree.cpp
# Opt level: O1

ostream * Indexing::operator<<(ostream *out,CodeTree *ct)

{
  long lVar1;
  int iVar2;
  CodeBlock *pCVar3;
  CodeOp *op;
  uint64_t uVar4;
  CodeOp *pCVar5;
  char cVar6;
  undefined8 uVar7;
  CodeOp *pCVar8;
  int iVar9;
  int iVar10;
  CodeOp *op_00;
  ulong uVar11;
  
  if (CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::
      $_0>(Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::$_0)const::top_ops == '\0'
     ) {
    operator<<();
  }
  CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::$_0>(Indexing
  ::operator<<(std::ostream&,Indexing::CodeTree_const&)::$_0)const::top_ops._16_8_ =
       CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::
       $_0>(Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::$_0)const::top_ops._8_8_;
  pCVar3 = ct->_entryPoint;
  if (pCVar3 != (CodeBlock *)0x0) {
    if (CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::
        $_0>(Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::$_0)const::top_ops._8_8_
        == CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::
           $_0>(Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::$_0)const::top_ops.
           _24_8_) {
      ::Lib::Stack<std::pair<Indexing::CodeTree::CodeOp_*,_unsigned_int>_>::expand
                ((Stack<std::pair<Indexing::CodeTree::CodeOp_*,_unsigned_int>_> *)
                 CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)
                 ::$_0>(Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::$_0)const::
                 top_ops);
    }
    uVar7 = CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::
            $_0>(Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::$_0)const::top_ops.
            _16_8_;
    *(CodeBlock **)
     CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::
     $_0>(Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::$_0)const::top_ops._16_8_ =
         pCVar3 + 8;
    *(undefined4 *)(uVar7 + 8) = 0;
    CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::
    $_0>(Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::$_0)const::top_ops._16_8_ =
         CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::
         $_0>(Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::$_0)const::top_ops.
         _16_8_ + 0x10;
  }
  if (CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::
      $_0>(Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::$_0)const::top_ops._16_8_
      != CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::
         $_0>(Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::$_0)const::top_ops.
         _8_8_) {
    do {
      lVar1 = CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::
              $_0>(Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::$_0)const::top_ops
              ._16_8_ + -0x10;
      op = *(CodeOp **)
            (CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::
             $_0>(Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::$_0)const::top_ops.
             _16_8_ + -0x10);
      iVar2 = *(int *)(CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::
                       CodeTree_const&)::$_0>(Indexing::operator<<(std::ostream&,Indexing::
                       CodeTree_const&)::$_0)const::top_ops._16_8_ + -8);
      cVar6 = (char)out;
      CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::
      $_0>(Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::$_0)const::top_ops._16_8_
           = lVar1;
      iVar9 = iVar2;
      if ((op->_content & 7) == 6) {
        for (; iVar9 != 0; iVar9 = iVar9 + -1) {
          std::__ostream_insert<char,std::char_traits<char>>(out,"  ",2);
        }
        operator<<(out,op);
        std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar6);
        std::ostream::put(cVar6);
        std::ostream::flush();
        pCVar8 = op->_alternative;
        if (pCVar8 != (CodeOp *)0x0) {
          if (CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::
              $_0>(Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::$_0)const::top_ops
              ._16_8_ ==
              CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::
              $_0>(Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::$_0)const::top_ops
              ._24_8_) {
            ::Lib::Stack<std::pair<Indexing::CodeTree::CodeOp_*,_unsigned_int>_>::expand
                      ((Stack<std::pair<Indexing::CodeTree::CodeOp_*,_unsigned_int>_> *)
                       CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::
                       CodeTree_const&)::$_0>(Indexing::operator<<(std::ostream&,Indexing::
                       CodeTree_const&)::$_0)const::top_ops);
          }
          uVar7 = CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::
                  CodeTree_const&)::$_0>(Indexing::operator<<(std::ostream&,Indexing::
                  CodeTree_const&)::$_0)const::top_ops._16_8_;
          *(CodeOp **)
           CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::
           $_0>(Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::$_0)const::top_ops.
           _16_8_ = pCVar8;
          *(int *)(uVar7 + 8) = iVar2;
          CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::
          $_0>(Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::$_0)const::top_ops.
          _16_8_ = CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::
                   CodeTree_const&)::$_0>(Indexing::operator<<(std::ostream&,Indexing::
                   CodeTree_const&)::$_0)const::top_ops._16_8_ + 0x10;
        }
        pCVar8 = op[1]._alternative;
        if ((CodeOp *)op[2]._content != pCVar8) {
          uVar11 = 0;
          do {
            uVar4 = (&pCVar8->_content)[uVar11];
            if (uVar4 != 0) {
              if (CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::
                  CodeTree_const&)::$_0>(Indexing::operator<<(std::ostream&,Indexing::
                  CodeTree_const&)::$_0)const::top_ops._16_8_ ==
                  CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::
                  CodeTree_const&)::$_0>(Indexing::operator<<(std::ostream&,Indexing::
                  CodeTree_const&)::$_0)const::top_ops._24_8_) {
                ::Lib::Stack<std::pair<Indexing::CodeTree::CodeOp_*,_unsigned_int>_>::expand
                          ((Stack<std::pair<Indexing::CodeTree::CodeOp_*,_unsigned_int>_> *)
                           CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::
                           CodeTree_const&)::$_0>(Indexing::operator<<(std::ostream&,Indexing::
                           CodeTree_const&)::$_0)const::top_ops);
              }
              uVar7 = CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::
                      CodeTree_const&)::$_0>(Indexing::operator<<(std::ostream&,Indexing::
                      CodeTree_const&)::$_0)const::top_ops._16_8_;
              *(uint64_t *)
               CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::
               $_0>(Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::$_0)const::
               top_ops._16_8_ = uVar4;
              *(int *)(uVar7 + 8) = iVar2 + 1;
              CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::
              $_0>(Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::$_0)const::top_ops
              ._16_8_ = CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::
                        CodeTree_const&)::$_0>(Indexing::operator<<(std::ostream&,Indexing::
                        CodeTree_const&)::$_0)const::top_ops._16_8_ + 0x10;
            }
            uVar11 = uVar11 + 1;
            pCVar8 = op[1]._alternative;
          } while (uVar11 < (ulong)((long)(op[2]._content - (long)pCVar8) >> 3));
        }
      }
      else {
        pCVar8 = op[-1]._alternative;
        if (pCVar8 != (CodeOp *)0x0) {
          iVar9 = iVar2 - (int)pCVar8;
          op_00 = op;
          do {
            iVar10 = (int)op[-1]._alternative;
            if ((iVar10 - (int)pCVar8) + iVar2 != 0) {
              iVar10 = iVar10 + iVar9;
              do {
                std::__ostream_insert<char,std::char_traits<char>>(out,"  ",2);
                iVar10 = iVar10 + -1;
              } while (iVar10 != 0);
            }
            operator<<(out,op_00);
            std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar6);
            std::ostream::put(cVar6);
            std::ostream::flush();
            pCVar5 = op_00->_alternative;
            if (pCVar5 != (CodeOp *)0x0) {
              iVar10 = *(int *)&op[-1]._alternative;
              if (CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::
                  CodeTree_const&)::$_0>(Indexing::operator<<(std::ostream&,Indexing::
                  CodeTree_const&)::$_0)const::top_ops._16_8_ ==
                  CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::
                  CodeTree_const&)::$_0>(Indexing::operator<<(std::ostream&,Indexing::
                  CodeTree_const&)::$_0)const::top_ops._24_8_) {
                ::Lib::Stack<std::pair<Indexing::CodeTree::CodeOp_*,_unsigned_int>_>::expand
                          ((Stack<std::pair<Indexing::CodeTree::CodeOp_*,_unsigned_int>_> *)
                           CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::
                           CodeTree_const&)::$_0>(Indexing::operator<<(std::ostream&,Indexing::
                           CodeTree_const&)::$_0)const::top_ops);
              }
              uVar7 = CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::
                      CodeTree_const&)::$_0>(Indexing::operator<<(std::ostream&,Indexing::
                      CodeTree_const&)::$_0)const::top_ops._16_8_;
              *(CodeOp **)
               CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::
               $_0>(Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::$_0)const::
               top_ops._16_8_ = pCVar5;
              *(int *)(uVar7 + 8) = (iVar10 - (int)pCVar8) + iVar2;
              CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::
              $_0>(Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::$_0)const::top_ops
              ._16_8_ = CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::
                        CodeTree_const&)::$_0>(Indexing::operator<<(std::ostream&,Indexing::
                        CodeTree_const&)::$_0)const::top_ops._16_8_ + 0x10;
            }
            op_00 = op_00 + 1;
            iVar9 = iVar9 + 1;
            pCVar8 = (CodeOp *)((long)&pCVar8[-1]._alternative + 7);
          } while (pCVar8 != (CodeOp *)0x0);
        }
      }
    } while (CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::
             $_0>(Indexing::operator<<(std::ostream&,Indexing::CodeTree_const&)::$_0)const::top_ops.
             _16_8_ != CodeTree::visitAllOps<Indexing::operator<<(std::ostream&,Indexing::
                       CodeTree_const&)::$_0>(Indexing::operator<<(std::ostream&,Indexing::
                       CodeTree_const&)::$_0)const::top_ops._8_8_);
  }
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const CodeTree& ct)
{
  ct.visitAllOps([&out](const CodeTree::CodeOp* op, unsigned depth) {
    for (unsigned i = 0; i < depth; i++) {
      out << "  ";
    }
    out << *op << std::endl;
  });
  return out;
}